

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O0

void (anonymous_namespace)::
     testScanLineImageChannel<Imath_3_2::half,(Imf_3_4::PixelType)1,Imath_3_2::half,(Imf_3_4::PixelType)1>
               (char *fileName,int width,int height,Compression compression)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  char *pcVar6;
  half *phVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int x_1;
  int y_1;
  InputFile in;
  FrameBuffer fb_1;
  Array2D<Imath_3_2::half> inPixels;
  OutputFile out;
  FrameBuffer fb;
  Header hdr;
  int x;
  int y;
  Array2D<Imath_3_2::half> outPixels;
  float in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar8;
  Compression compression_00;
  half in_stack_fffffffffffffdd4;
  half in_stack_fffffffffffffdd6;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffddc;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffde0;
  int local_1b8;
  int local_1b4;
  undefined1 local_1b0 [88];
  char local_158 [48];
  Array2D<Imath_3_2::half> local_128;
  undefined1 local_110 [72];
  char local_c8 [52];
  Channel local_94 [28];
  Vec2<float> local_78;
  Header local_70 [56];
  int local_38;
  int local_34;
  Array2D<Imath_3_2::half> local_30;
  int local_14;
  int local_10;
  int local_c;
  char *local_8;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"scan lines, compression ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::operator<<(poVar4,"output type ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = std::operator<<(poVar4,"input type ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,1);
  poVar4 = std::operator<<(poVar4,":\n    ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffde0,CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
             ,CONCAT26(in_stack_fffffffffffffdd6._h,
                       CONCAT24(in_stack_fffffffffffffdd4._h,in_stack_fffffffffffffdd0)));
  for (local_34 = 0; iVar1 = local_c, iVar3 = local_10, local_34 < local_10; local_34 = local_34 + 1
      ) {
    for (local_38 = 0; local_38 < local_c; local_38 = local_38 + 1) {
      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_30,(long)local_34);
      Imath_3_2::half::operator=
                ((half *)CONCAT26(in_stack_fffffffffffffdd6._h,
                                  CONCAT24(in_stack_fffffffffffffdd4._h,in_stack_fffffffffffffdd0)),
                 in_stack_fffffffffffffdcc);
    }
  }
  Imath_3_2::Vec2<float>::Vec2(&local_78,0.0,0.0);
  Imf_3_4::Header::Header
            (local_70,iVar1,iVar3,1.0,(Vec2 *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION);
  piVar5 = (int *)Imf_3_4::Header::compression();
  *piVar5 = local_14;
  pcVar6 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_94,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar6,(Channel *)0x22e4ae);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1693d5);
  phVar7 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_30,0);
  uVar9 = 0;
  uVar8 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_110 + 0x10),HALF,(char *)phVar7,2,(long)local_c * 2,1,1,0.0,false,false
            );
  Imf_3_4::FrameBuffer::insert(local_c8,(Slice *)0x22e4ae);
  poVar4 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  pcVar6 = local_8;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)local_110,pcVar6,local_70,iVar3);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)local_110);
  Imf_3_4::OutputFile::writePixels((int)local_110);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)local_110);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1694f5);
  Imf_3_4::Header::~Header(local_70);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffde0,CONCAT44(in_stack_fffffffffffffddc,uVar9),
             CONCAT26(in_stack_fffffffffffffdd6._h,CONCAT24(in_stack_fffffffffffffdd4._h,uVar8)));
  poVar4 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x16955b);
  phVar7 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_128,0);
  compression_00 = NO_COMPRESSION;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_1b0 + 0x20),HALF,(char *)phVar7,2,(long)local_c * 2,1,1,0.0,false,false
            );
  Imf_3_4::FrameBuffer::insert(local_158,(Slice *)0x22e4ae);
  pcVar6 = local_8;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)local_1b0,pcVar6,iVar3);
  Imf_3_4::InputFile::setFrameBuffer((FrameBuffer *)local_1b0);
  Imf_3_4::InputFile::readPixels((int)local_1b0,0);
  Imf_3_4::InputFile::~InputFile
            ((InputFile *)
             CONCAT26(in_stack_fffffffffffffdd6._h,
                      CONCAT24(in_stack_fffffffffffffdd4._h,compression_00)));
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x16964a);
  poVar4 = std::operator<<((ostream *)&std::cout,"comparing");
  std::ostream::operator<<(poVar4,std::flush<char,std::char_traits<char>>);
  local_1b4 = 0;
  do {
    if (local_10 <= local_1b4) {
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      remove(local_8);
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                ((Array2D<Imath_3_2::half> *)
                 CONCAT26(in_stack_fffffffffffffdd6._h,
                          CONCAT24(in_stack_fffffffffffffdd4._h,compression_00)));
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                ((Array2D<Imath_3_2::half> *)
                 CONCAT26(in_stack_fffffffffffffdd6._h,
                          CONCAT24(in_stack_fffffffffffffdd4._h,compression_00)));
      return;
    }
    for (local_1b8 = 0; local_1b8 < local_c; local_1b8 = local_1b8 + 1) {
      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_128,(long)local_1b4);
      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_30,(long)local_1b4);
      bVar2 = anon_unknown.dwarf_7fa20::isEquivalent<Imath_3_2::half>
                        (in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd4,compression_00);
      if (!bVar2) {
        __assert_fail("isEquivalent ( inPixels[y][x], InType (outPixels[y][x]), compression)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                      ,0xd4,
                      "void (anonymous namespace)::testScanLineImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = Imath_3_2::half, InTypeTag = Imf_3_4::HALF]"
                     );
      }
    }
    local_1b4 = local_1b4 + 1;
  } while( true );
}

Assistant:

void
testScanLineImageChannel (
    const char fileName[], int width, int height, Compression compression)
{
    cout << "scan lines, "
            "compression "
         << compression << ", "
         << "output type " << OutTypeTag << ", "
         << "input type " << InTypeTag << ":\n    " << flush;

    Array2D<OutType> outPixels (height, width);

    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
            outPixels[y][x] = x * 10 + y;

    {
        Header hdr (width, height);

        hdr.compression () = compression;

        hdr.channels ().insert (
            "X",                   // name
            Channel (OutTypeTag)); // type

        FrameBuffer fb;

        fb.insert (
            "X", // name
            Slice (
                OutTypeTag,                         // type
                (char*) &outPixels[0][0],           // base
                sizeof (outPixels[0][0]),           // xStride
                sizeof (outPixels[0][0]) * width)); // yStride

        cout << "writing " << flush;

        OutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        out.writePixels (height);
    }

    Array2D<InType> inPixels (height, width);

    {
        cout << "reading " << flush;

        FrameBuffer fb;

        fb.insert (
            "X", // name
            Slice (
                InTypeTag,                         // type
                (char*) &inPixels[0][0],           // base
                sizeof (inPixels[0][0]),           // xStride
                sizeof (inPixels[0][0]) * width)); // yStride

        InputFile in (fileName);
        in.setFrameBuffer (fb);
        in.readPixels (0, height - 1);
    }

    cout << "comparing" << flush;

    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            assert (isEquivalent (
                inPixels[y][x], InType (outPixels[y][x]), compression));
        }
    }

    cout << endl;

    remove (fileName);
}